

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

basic_ostream<wchar_t,_std::char_traits<wchar_t>_> * __thiscall
pstore::dump::array::writer<std::wostream>
          (array *this,basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os,indent *ind)

{
  pointer psVar1;
  element_type *peVar2;
  bool bVar3;
  int iVar4;
  ulong in_RAX;
  wostream *pwVar5;
  undefined4 extraout_var;
  value_ptr *value_1;
  pointer psVar6;
  char *pcVar7;
  value_ptr *value;
  undefined8 local_38;
  
  local_38 = in_RAX;
  if (((this->values_).
       super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
       ._M_impl.super__Vector_impl_data._M_finish !=
       (this->values_).
       super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
       ._M_impl.super__Vector_impl_data._M_start) && (bVar3 = is_number_array(this), !bVar3)) {
    std::operator<<(os,'\n');
    psVar1 = (this->values_).
             super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pcVar7 = "";
    for (psVar6 = (this->values_).
                  super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar1; psVar6 = psVar6 + 1)
    {
      pwVar5 = std::operator<<(os,pcVar7);
      pwVar5 = dump::operator<<(pwVar5,ind);
      std::operator<<(pwVar5,"- ");
      peVar2 = (psVar6->super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      iVar4 = (*peVar2->_vptr_value[2])(peVar2);
      local_38 = CONCAT44(local_38._4_4_,
                          ind->count_ + (uint)(CONCAT44(extraout_var,iVar4) == 0) * 2 + 2);
      (*peVar2->_vptr_value[0x16])(peVar2,os,&local_38);
      pcVar7 = "\n";
    }
    return os;
  }
  std::operator<<(os,"[");
  psVar1 = (this->values_).
           super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pcVar7 = " ";
  for (psVar6 = (this->values_).
                super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar1; psVar6 = psVar6 + 1) {
    std::operator<<(os,pcVar7);
    peVar2 = (psVar6->super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_38 = local_38 & 0xffffffff;
    (*peVar2->_vptr_value[0x16])(peVar2,os,(long)&local_38 + 4);
    pcVar7 = ", ";
  }
  std::operator<<(os," ]");
  return os;
}

Assistant:

OStream & array::writer (OStream & os, indent const & ind) const {
            char const * sep = "";

            bool const is_compact = values_.size () == 0 || this->is_number_array ();
            if (is_compact) {
                os << "[";
                sep = " ";
                for (value_ptr const & value : values_) {
                    os << sep;
                    value->write_impl (os, indent ());
                    sep = ", ";
                }
                os << " ]";
            } else {
                os << '\n';
                for (value_ptr const & value : values_) {
                    os << sep << ind << "- ";
                    value->write_impl (os,
                                       ind.next (value->dynamic_cast_object () == nullptr ? 4 : 2));
                    sep = "\n";
                }
            }
            return os;
        }